

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O0

string * kj::_::anon_unknown_0::fileLine(string *__return_storage_ptr__,string *file,int line)

{
  char *pcVar1;
  size_t extraout_RDX;
  StringPtr filename;
  char local_68 [8];
  char buffer [32];
  StringPtr local_40;
  ArrayPtr<const_char> local_30;
  uint local_1c;
  string *psStack_18;
  int line_local;
  string *file_local;
  
  local_1c = line;
  psStack_18 = file;
  file_local = __return_storage_ptr__;
  pcVar1 = (char *)::std::__cxx11::string::c_str();
  StringPtr::StringPtr(&local_40,pcVar1);
  filename.content.size_ = extraout_RDX;
  filename.content.ptr = (char *)local_40.content.size_;
  local_30 = (ArrayPtr<const_char>)trimSourceFilename((kj *)local_40.content.ptr,filename);
  pcVar1 = StringPtr::cStr((StringPtr *)&local_30);
  ::std::__cxx11::string::operator=((string *)file,pcVar1);
  ::std::__cxx11::string::operator+=((string *)file,':');
  sprintf(local_68,"%d",(ulong)local_1c);
  ::std::__cxx11::string::operator+=((string *)file,local_68);
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)file);
  return __return_storage_ptr__;
}

Assistant:

std::string fileLine(std::string file, int line) {
  file = trimSourceFilename(file.c_str()).cStr();

  file += ':';
  char buffer[32];
  sprintf(buffer, "%d", line);
  file += buffer;
  return file;
}